

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall llm_graph_input_s_copy::set_input(llm_graph_input_s_copy *this,llama_ubatch *ubatch)

{
  void *pvVar1;
  llama_kv_cache_unified *plVar2;
  char cVar3;
  int32_t *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this->s_copy != (ggml_tensor *)0x0) {
    uVar7 = (ulong)this->kv_self->n;
    cVar3 = ggml_backend_buffer_is_host(this->s_copy->buffer);
    if (cVar3 == '\0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x10c,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(s_copy->buffer)");
    }
    if (uVar7 != 0) {
      pvVar1 = this->s_copy->data;
      plVar2 = this->kv_self;
      piVar4 = &((plVar2->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start)->src;
      uVar5 = 0;
      do {
        uVar6 = plVar2->head + (int)uVar5;
        if ((*piVar4 < 0) || (plVar2->size <= (uint)*piVar4)) {
          *piVar4 = uVar6;
        }
        *(int32_t *)((long)pvVar1 + uVar5 * 4) = *piVar4;
        if (uVar6 != *piVar4) {
          *piVar4 = uVar6;
        }
        uVar5 = uVar5 + 1;
        piVar4 = piVar4 + 0x10;
      } while (uVar7 != uVar5);
    }
  }
  return;
}

Assistant:

void llm_graph_input_s_copy::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    const int64_t n_kv = kv_self->n;

    if (s_copy) {
        GGML_ASSERT(ggml_backend_buffer_is_host(s_copy->buffer));
        int32_t * data = (int32_t *) s_copy->data;

        // assuming copy destinations ALWAYS happen ONLY on the cells between head and head+n
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t  cell_id = i + kv_self->head;

            //////////////////////////////////////////////
            // TODO: this should not mutate the KV cache !
            llama_kv_cell & kv_cell = const_cast<class llama_kv_cache_unified *>(kv_self)->cells[i];

            // prevent out-of-bound sources
            if (kv_cell.src < 0 || (uint32_t) kv_cell.src >= kv_self->size) {
                kv_cell.src = cell_id;
            }

            data[i] = kv_cell.src;

            // TODO: do not mutate the KV cache
            // ensure copy only happens once
            if (kv_cell.src != (int32_t) cell_id) {
                kv_cell.src = cell_id;
            }
        }
    }
}